

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderBody
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  StructDef *struct_def_00;
  string *__lhs;
  bool bVar1;
  reference ppFVar2;
  char *nameprefix_00;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  FieldDef *local_118;
  FieldDef *field;
  undefined1 local_108 [8];
  const_reverse_iterator it;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  char *nameprefix_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)nameprefix;
  nameprefix_local = (char *)struct_def;
  struct_def_local = (StructDef *)this;
  NumToString<unsigned_long>(&local_d0,struct_def->minalign);
  std::operator+(&local_b0,"    b_.Prep(",&local_d0);
  std::operator+(&local_90,&local_b0,", ");
  NumToString<unsigned_long>((string *)&it,*(unsigned_long *)(nameprefix_local + 0x120));
  std::operator+(&local_70,&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
  std::operator+(&local_50,&local_70,")\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_108)
  ;
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_108,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar1) break;
    ppFVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_108);
    local_118 = *ppFVar2;
    if (local_118->padding != 0) {
      NumToString<unsigned_long>(&local_178,local_118->padding);
      std::operator+(&local_158,"    b_.Pad(",&local_178);
      std::operator+(&local_138,&local_158,")\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    bVar1 = IsStruct(&(local_118->value).type);
    __lhs = code_ptr_local;
    if (bVar1) {
      struct_def_00 = (local_118->value).type.struct_def;
      NormalizedName_abi_cxx11_(&local_1d8,this,&local_118->super_Definition);
      std::operator+(&local_1b8,&local_1d8,"_");
      std::operator+(&local_198,(char *)__lhs,&local_1b8);
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      StructBuilderBody(this,struct_def_00,nameprefix_00,code);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      GenMethod_abi_cxx11_(&local_298,this,&(local_118->value).type);
      std::operator+(&local_278,"    b_.Prepend",&local_298);
      std::operator+(&local_258,&local_278,"(");
      std::operator+(&local_238,&local_258,(char *)code_ptr_local);
      NormalizedName_abi_cxx11_(&local_2b8,this,&local_118->super_Definition);
      std::operator+(&local_218,&local_238,&local_2b8);
      std::operator+(&local_1f8,&local_218,")\n");
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_108);
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "    b_.Prep(" + NumToString(struct_def.minalign) + ", " +
            NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "    b_.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        code += "    b_.Prepend" + GenMethod(field.value.type) + "(" +
                nameprefix + NormalizedName(field) + ")\n";
      }
    }
  }